

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xar_cleanup(archive_read *a)

{
  void *__ptr;
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  _func_int_archive_md5_ctx_ptr_void_ptr **pp_Var4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  xar *xar;
  unknown_tag *tag;
  uchar sum [20];
  undefined1 auStack_38 [24];
  
  __ptr = a->format->data;
  if (*(int *)((long)__ptr + 0x170) == 1) {
    pp_Var4 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
    lVar6 = 0x180;
LAB_0014e327:
    (**pp_Var4)((archive_md5_ctx *)(lVar6 + (long)__ptr),auStack_38);
  }
  else if (*(int *)((long)__ptr + 0x170) == 2) {
    pp_Var4 = &__archive_digest.md5final;
    lVar6 = 0x178;
    goto LAB_0014e327;
  }
  if (*(int *)((long)__ptr + 0x188) == 1) {
    pp_Var4 = (_func_int_archive_md5_ctx_ptr_void_ptr **)&__archive_digest.sha1final;
    lVar6 = 0x198;
  }
  else {
    if (*(int *)((long)__ptr + 0x188) != 2) goto LAB_0014e35d;
    pp_Var4 = &__archive_digest.md5final;
    lVar6 = 400;
  }
  (**pp_Var4)((archive_md5_ctx *)(lVar6 + (long)__ptr),auStack_38);
LAB_0014e35d:
  pvVar1 = a->format->data;
  iVar5 = 0;
  if ((*(int *)((long)pvVar1 + 0xd8) != 0) &&
     (iVar3 = inflateEnd((long)pvVar1 + 0x68), iVar5 = 0, iVar3 != 0)) {
    archive_set_error(&a->archive,-1,"Failed to clean up zlib decompressor");
    iVar5 = -0x1e;
  }
  if (*(int *)((long)pvVar1 + 0x168) != 0) {
    lzma_end((long)pvVar1 + 0xe0);
  }
  puVar7 = *(undefined8 **)((long)__ptr + 0x1c8);
  while (puVar7 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*puVar7;
    free(puVar7);
    puVar7 = puVar2;
  }
  if (0 < *(int *)((long)__ptr + 0x1bc)) {
    lVar6 = 0;
    do {
      file_free(*(xar_file **)(*(long *)((long)__ptr + 0x1b0) + lVar6 * 8));
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)((long)__ptr + 0x1bc));
  }
  puVar7 = *(undefined8 **)((long)__ptr + 0x1b0);
  while( true ) {
    free(puVar7);
    puVar7 = *(undefined8 **)((long)__ptr + 0x30);
    if (puVar7 == (undefined8 *)0x0) break;
    *(undefined8 *)((long)__ptr + 0x30) = *puVar7;
    archive_string_free((archive_string *)(puVar7 + 1));
  }
  free(*(void **)((long)__ptr + 0x20));
  free(__ptr);
  a->format->data = (void *)0x0;
  return iVar5;
}

Assistant:

static int
xar_cleanup(struct archive_read *a)
{
	struct xar *xar;
	struct hdlink *hdlink;
	int i;
	int r;

	xar = (struct xar *)(a->format->data);
	checksum_cleanup(a);
	r = decompression_cleanup(a);
	hdlink = xar->hdlink_list;
	while (hdlink != NULL) {
		struct hdlink *next = hdlink->next;

		free(hdlink);
		hdlink = next;
	}
	for (i = 0; i < xar->file_queue.used; i++)
		file_free(xar->file_queue.files[i]);
	free(xar->file_queue.files);
	while (xar->unknowntags != NULL) {
		struct unknown_tag *tag;

		tag = xar->unknowntags;
		xar->unknowntags = tag->next;
		archive_string_free(&(tag->name));
		free(tag);
	}
	free(xar->outbuff);
	free(xar);
	a->format->data = NULL;
	return (r);
}